

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_storage.cpp
# Opt level: O1

void __thiscall duckdb::InMemoryLogStorage::FlushInternal(InMemoryLogStorage *this)

{
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *puVar1;
  pointer pDVar2;
  pointer pCVar3;
  type pDVar4;
  
  puVar1 = &this->entry_buffer;
  pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (puVar1);
  if (pDVar2->count != 0) {
    pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->log_entries);
    pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                       (puVar1);
    ColumnDataCollection::Append(pCVar3,pDVar4);
    pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       (puVar1);
    DataChunk::Reset(pDVar2);
  }
  puVar1 = &this->log_context_buffer;
  pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (puVar1);
  if (pDVar2->count != 0) {
    pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->log_contexts);
    pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                       (puVar1);
    ColumnDataCollection::Append(pCVar3,pDVar4);
    pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       (puVar1);
    DataChunk::Reset(pDVar2);
    return;
  }
  return;
}

Assistant:

void InMemoryLogStorage::FlushInternal() {
	if (entry_buffer->size() > 0) {
		log_entries->Append(*entry_buffer);
		entry_buffer->Reset();
	}

	if (log_context_buffer->size() > 0) {
		log_contexts->Append(*log_context_buffer);
		log_context_buffer->Reset();
	}
}